

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmBitDxEa<(moira::Instr)34,(moira::Mode)4,(moira::Size)1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  char *pcVar1;
  byte *pbVar2;
  StrWriter *this_00;
  Ea<(moira::Mode)4,_(moira::Size)1> dst;
  Ea<(moira::Mode)4,_(moira::Size)1> local_34;
  
  local_34.reg = op & 7;
  local_34.pc = *addr;
  this_00 = StrWriter::operator<<(str);
  StrWriter::operator<<(this_00,(Align)(this->tab).raw);
  pcVar1 = this_00->ptr;
  this_00->ptr = pcVar1 + 1;
  *pcVar1 = 'D';
  pbVar2 = (byte *)this_00->ptr;
  this_00->ptr = (char *)(pbVar2 + 1);
  *pbVar2 = (byte)(op >> 9) & 7 | 0x30;
  StrWriter::operator<<(this_00,", ");
  StrWriter::operator<<(this_00,&local_34);
  return;
}

Assistant:

void
Moira::dasmBitDxEa(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Dn       ( ____xxx_________(op)       );
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    str << Ins<I>{} << tab << src << ", " << dst;
}